

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getsym.h
# Opt level: O3

int insertIdentifier(string *str)

{
  pointer __s2;
  size_t __n;
  pointer pbVar1;
  int iVar2;
  int iVar3;
  pointer pbVar4;
  
  pbVar1 = identifierArray_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = identifierArray_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (identifierArray_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      identifierArray_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
LAB_001028e4:
    if (pbVar4 != pbVar1) {
      return iVar3;
    }
  }
  else {
    __s2 = (str->_M_dataplus)._M_p;
    __n = str->_M_string_length;
    iVar3 = 0;
    do {
      if ((pbVar4->_M_string_length == __n) &&
         ((__n == 0 || (iVar2 = bcmp((pbVar4->_M_dataplus)._M_p,__s2,__n), iVar2 == 0))))
      goto LAB_001028e4;
      iVar3 = iVar3 + 1;
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&identifierArray_abi_cxx11_,str);
  return iVar3;
}

Assistant:

int insertIdentifier(const string& str)      //插入到标识符符号表
{
    int location = 0;
    auto itd = identifierArray.begin();
    for (; itd != identifierArray.end(); ++itd) {
        if (*itd == str)
            break;
        location++;
    }
    if (itd == identifierArray.end()) {
        identifierArray.push_back(str);
        return location;
    }
    else
        return location;
}